

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  size_type *psVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppTVar4;
  int iVar5;
  tm *ptVar6;
  long *plVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  UnitTestImpl *pUVar10;
  bool bVar11;
  ulong *puVar12;
  TimeInMillis ms;
  pointer ppTVar13;
  pointer ppTVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint uVar17;
  long lVar18;
  long in_FS_OFFSET;
  string kIndent;
  string kTestsuites;
  tm time_struct;
  int local_2f4;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  undefined1 local_70 [56];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"testsuites","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  pcVar2 = local_70 + 0x10;
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"tests","");
  iVar5 = UnitTestImpl::reportable_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_290,(string *)local_70,iVar5,&local_2b0,true);
  if ((char *)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
  }
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"failures","");
  iVar5 = UnitTestImpl::failed_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_290,(string *)local_70,iVar5,&local_2b0,true);
  if ((char *)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
  }
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"disabled","");
  iVar5 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_290,(string *)local_70,iVar5,&local_2b0,true);
  if ((char *)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
  }
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"errors","");
  OutputJsonKey(stream,&local_290,(string *)local_70,0,&local_2b0,true);
  if ((char *)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_70._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"random_seed","");
    OutputJsonKey(stream,&local_290,(string *)local_70,unit_test->impl_->random_seed_,&local_2b0,
                  true);
    if ((char *)local_70._0_8_ != pcVar2) {
      operator_delete((void *)local_70._0_8_,CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
    }
  }
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"timestamp","");
  local_90._M_dataplus._M_p = (pointer)(unit_test->impl_->start_timestamp_ / 1000);
  ptVar6 = localtime_r((time_t *)&local_90,(tm *)local_70);
  if (ptVar6 == (tm *)0x0) {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    local_2f0._M_string_length = 0;
    local_2f0.field_2._M_allocated_capacity =
         local_2f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    goto LAB_00151c14;
  }
  local_2f4 = local_70._20_4_ + 0x76c;
  StreamableToString<int>(&local_1d0,&local_2f4);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_1a0 = *puVar12;
    lStack_198 = plVar7[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar12;
    local_1b0 = (ulong *)*plVar7;
  }
  local_1a8 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_1f0,(String *)(ulong)(local_70._16_4_ + 1),(int)local_1a8);
  uVar15 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar15 = local_1a0;
  }
  if (uVar15 < local_1f0._M_string_length + local_1a8) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      uVar16 = local_1f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_1f0._M_string_length + local_1a8) goto LAB_00151406;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_00151406:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1f0._M_dataplus._M_p);
  }
  local_190 = &local_180;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_180 = *plVar7;
    uStack_178 = puVar8[3];
  }
  else {
    local_180 = *plVar7;
    local_190 = (long *)*puVar8;
  }
  local_188 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_160 = *puVar12;
    lStack_158 = plVar7[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar12;
    local_170 = (ulong *)*plVar7;
  }
  local_168 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_210,(String *)(ulong)(uint)local_70._12_4_,(int)local_168);
  uVar15 = 0xf;
  if (local_170 != &local_160) {
    uVar15 = local_160;
  }
  if (uVar15 < local_210._M_string_length + local_168) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar16 = local_210.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_210._M_string_length + local_168) goto LAB_0015154f;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_0015154f:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_210._M_dataplus._M_p);
  }
  local_150 = &local_140;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_140 = *plVar7;
    uStack_138 = puVar8[3];
  }
  else {
    local_140 = *plVar7;
    local_150 = (long *)*puVar8;
  }
  local_148 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_120 = *puVar12;
    lStack_118 = plVar7[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar12;
    local_130 = (ulong *)*plVar7;
  }
  local_128 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_230,(String *)(ulong)(uint)local_70._8_4_,(int)local_128);
  uVar15 = 0xf;
  if (local_130 != &local_120) {
    uVar15 = local_120;
  }
  if (uVar15 < local_230._M_string_length + local_128) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar16 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_230._M_string_length + local_128) goto LAB_00151698;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00151698:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_230._M_dataplus._M_p);
  }
  local_110 = &local_100;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_100 = *plVar7;
    uStack_f8 = puVar8[3];
  }
  else {
    local_100 = *plVar7;
    local_110 = (long *)*puVar8;
  }
  local_108 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_e0 = *puVar12;
    lStack_d8 = plVar7[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar12;
    local_f0 = (ulong *)*plVar7;
  }
  local_e8 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_250,(String *)((ulong)local_70._0_8_ >> 0x20),(int)local_e8);
  uVar15 = 0xf;
  if (local_f0 != &local_e0) {
    uVar15 = local_e0;
  }
  if (uVar15 < local_250._M_string_length + local_e8) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar16 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_250._M_string_length + local_e8) goto LAB_001517e1;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_001517e1:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_250._M_dataplus._M_p);
  }
  local_d0 = &local_c0;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_c0 = *plVar7;
    uStack_b8 = puVar8[3];
  }
  else {
    local_c0 = *plVar7;
    local_d0 = (long *)*puVar8;
  }
  local_c8 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_a0 = *puVar12;
    lStack_98 = plVar7[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar12;
    local_b0 = (ulong *)*plVar7;
  }
  local_a8 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_270,(String *)(local_70._0_8_ & 0xffffffff),(int)local_a8);
  uVar15 = 0xf;
  if (local_b0 != &local_a0) {
    uVar15 = local_a0;
  }
  if (uVar15 < local_270._M_string_length + local_a8) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar16 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_270._M_string_length + local_a8) goto LAB_0015192c;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0015192c:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_270._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_90.field_2._M_allocated_capacity = *psVar1;
    local_90.field_2._8_8_ = puVar8[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar1;
    local_90._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_90._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  puVar12 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_2f0.field_2._M_allocated_capacity = *puVar12;
    local_2f0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *puVar12;
    local_2f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2f0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
LAB_00151c14:
  OutputJsonKey(stream,&local_290,&local_2d0,&local_2f0,&local_2b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_90,(internal *)unit_test->impl_->elapsed_time_,ms);
  OutputJsonKey(stream,&local_290,(string *)local_70,&local_90,&local_2b0,false);
  paVar3 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
  }
  TestPropertiesAsJson((string *)local_70,&unit_test->impl_->ad_hoc_test_result_,&local_2b0);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_70._0_8_,CONCAT44(local_70._12_4_,local_70._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",\n",2);
  if ((char *)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
  }
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"name","");
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"AllTests","");
  OutputJsonKey(stream,&local_290,(string *)local_70,&local_90,&local_2b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,CONCAT44(local_70._20_4_,local_70._16_4_) + 1);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\": [\n",5);
  pUVar10 = unit_test->impl_;
  ppTVar13 = (pUVar10->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar10->test_cases_).
                              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar13) >> 3)) {
    lVar18 = 0;
    bVar11 = false;
    do {
      ppTVar14 = (ppTVar13[lVar18]->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar4 = *(pointer *)
                 ((long)&(ppTVar13[lVar18]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar14 != ppTVar4) {
        iVar5 = 0;
        do {
          uVar17 = (*ppTVar14)->is_in_another_shard_ ^ 1;
          if ((*ppTVar14)->matches_filter_ == false) {
            uVar17 = 0;
          }
          iVar5 = iVar5 + uVar17;
          ppTVar14 = ppTVar14 + 1;
        } while (ppTVar14 != ppTVar4);
        if (iVar5 != 0) {
          if (bVar11) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            pUVar10 = unit_test->impl_;
          }
          PrintJsonTestCase(stream,(pUVar10->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar18]);
          pUVar10 = unit_test->impl_;
          bVar11 = true;
        }
      }
      lVar18 = lVar18 + 1;
      ppTVar13 = (pUVar10->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (lVar18 < (int)((ulong)((long)(pUVar10->test_cases_).
                                          super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppTVar13) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}